

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8x4.c
# Opt level: O3

image_u8x4_t * image_u8x4_create_from_pam(char *inpath)

{
  int iVar1;
  uint8_t *puVar2;
  pam_t *pam;
  image_u8x4_t *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  pam = pam_create_from_file(inpath);
  if (pam == (pam_t *)0x0) {
    piVar3 = (image_u8x4_t *)0x0;
  }
  else {
    piVar3 = image_u8x4_create_alignment(pam->width,pam->height,0x40);
    if (0 < pam->height) {
      iVar9 = 0;
      iVar7 = 0;
      do {
        iVar1 = pam->depth;
        if (iVar1 == 1) {
          uVar8 = (ulong)(uint)pam->width;
          if (0 < pam->width) {
            puVar2 = piVar3->buf;
            lVar4 = (long)iVar7;
            lVar5 = piVar3->stride * lVar4;
            lVar6 = 0;
            do {
              puVar2[lVar6 * 4 + lVar5] = pam->data[lVar6 + (int)uVar8 * iVar7];
              puVar2[lVar6 * 4 + lVar5 + 1] = pam->data[lVar6 + pam->width * lVar4];
              puVar2[lVar6 * 4 + lVar5 + 2] = pam->data[lVar6 + pam->width * lVar4];
              puVar2[lVar6 * 4 + lVar5 + 3] = 0xff;
              lVar6 = lVar6 + 1;
              uVar8 = (ulong)pam->width;
            } while (lVar6 < (long)uVar8);
          }
        }
        else if (iVar1 == 4) {
          lVar4 = (long)pam->width * 4;
          memcpy(piVar3->buf + (long)piVar3->stride * (long)iVar7,pam->data + iVar7 * lVar4,
                 (long)(int)lVar4);
        }
        else {
          if (iVar1 != 3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/image_u8x4.c"
                          ,0x70,"image_u8x4_t *image_u8x4_create_from_pam(const char *)");
          }
          uVar8 = (ulong)(uint)pam->width;
          if (0 < pam->width) {
            puVar2 = piVar3->buf;
            lVar5 = (long)iVar7 * (long)piVar3->stride;
            lVar4 = 2;
            lVar6 = 0;
            do {
              puVar2[lVar6 * 4 + lVar5] = pam->data[lVar4 + -2 + (long)((int)uVar8 * iVar9)];
              puVar2[lVar6 * 4 + lVar5 + 1] = pam->data[lVar4 + -1 + (long)(pam->width * iVar9)];
              puVar2[lVar6 * 4 + lVar5 + 2] = pam->data[lVar4 + pam->width * iVar9];
              puVar2[lVar6 * 4 + lVar5 + 3] = 0xff;
              lVar6 = lVar6 + 1;
              uVar8 = (ulong)pam->width;
              lVar4 = lVar4 + 3;
            } while (lVar6 < (long)uVar8);
          }
        }
        iVar7 = iVar7 + 1;
        iVar9 = iVar9 + 3;
      } while (iVar7 < pam->height);
    }
    pam_destroy(pam);
  }
  return piVar3;
}

Assistant:

image_u8x4_t *image_u8x4_create_from_pam(const char *inpath)
{
    pam_t *pam = pam_create_from_file(inpath);
    if (!pam)
        return NULL;

    image_u8x4_t *im = image_u8x4_create(pam->width, pam->height);

    for (int y = 0; y < pam->height; y++) {
        if (pam->depth == 1) {
            for (int x = 0; x < pam->width; x++) {
                im->buf[y*im->stride + 4*x + 0] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 1] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 2] = pam->data[pam->width*y + x + 0];
                im->buf[y*im->stride + 4*x + 3] = 255;
            }
        } else if (pam->depth == 3) {
            for (int x = 0; x < pam->width; x++) {
                im->buf[y*im->stride + 4*x + 0] = pam->data[3*pam->width*y + 3*x + 0];
                im->buf[y*im->stride + 4*x + 1] = pam->data[3*pam->width*y + 3*x + 1];
                im->buf[y*im->stride + 4*x + 2] = pam->data[3*pam->width*y + 3*x + 2];
                im->buf[y*im->stride + 4*x + 3] = 255;
            }
        } else if (pam->depth == 4) {
            memcpy(&im->buf[y*im->stride], &pam->data[4*pam->width*y], 4*pam->width);
        } else {
            assert(0); // not implemented
        }
    }

    pam_destroy(pam);
    return im;
}